

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.h
# Opt level: O0

void __thiscall CGI::CGI(CGI *this,CharContent *path,CharContent *name,int connfd)

{
  int connfd_local;
  CharContent *name_local;
  CharContent *path_local;
  CGI *this_local;
  
  this->_vptr_CGI = (_func_int **)&PTR__CGI_00132d38;
  CharContent::CharContent(&this->_path,path);
  CharContent::CharContent(&this->_name,name);
  this->_connfd = connfd;
  return;
}

Assistant:

CGI(const CharContent &path,const CharContent &name,int connfd):_path(path),_name(name),_connfd(connfd){}